

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void add_bb_insn_dead_vars(gen_ctx_t gen_ctx)

{
  bb_t_conflict pbVar1;
  MIR_insn_t pMVar2;
  MIR_reg_t MVar3;
  bb_insn_t_conflict bb_insn;
  int iVar4;
  uint uVar5;
  bitmap_t bm;
  DLIST_bb_t *pDVar6;
  ulong uVar7;
  DLIST_dead_var_t *pDVar8;
  dead_var_t_conflict pdVar9;
  MIR_reg_t var;
  int op_num;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  bb_insn_t_conflict local_80;
  bb_insn_t_conflict local_78;
  DLIST_dead_var_t *local_70;
  bb_t_conflict local_68;
  MIR_insn_t local_60;
  DLIST_dead_var_t *local_58;
  insn_var_iterator_t insn_var_iter;
  
  if (gen_ctx->optimize_level == 0) {
    __assert_fail("gen_ctx->optimize_level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
  }
  bm = bitmap_create2(0x100);
  local_58 = &gen_ctx->free_dead_vars;
  pDVar6 = &gen_ctx->curr_cfg->bbs;
  do {
    pbVar1 = pDVar6->head;
    if (pbVar1 == (bb_t_conflict)0x0) {
      bitmap_destroy(bm);
      return;
    }
    bitmap_copy(bm,pbVar1->out);
    local_80 = (pbVar1->bb_insns).tail;
    local_68 = pbVar1;
    while (bb_insn = local_80, local_80 != (bb_insn_t_conflict)0x0) {
      local_80 = (local_80->bb_insn_link).prev;
      clear_bb_insn_dead_vars(gen_ctx,bb_insn);
      local_78 = bb_insn;
      pMVar2 = bb_insn->insn;
      insn_var_iter.nops = (size_t)*(uint *)&pMVar2->field_0x1c;
      insn_var_iter.op_num = 0;
      insn_var_iter.op_part_num = 0;
      insn_var_iter.insn = pMVar2;
      while (iVar4 = output_insn_var_iterator_next(gen_ctx,&insn_var_iter,&var,&op_num), iVar4 != 0)
      {
        uVar5 = var_to_scan_var(gen_ctx,var);
        if (-1 < (int)uVar5) {
          bitmap_clear_bit_p(bm,(ulong)uVar5);
        }
      }
      uVar7 = *(ulong *)&pMVar2->field_0x18;
      if ((gen_ctx->lr_ctx->scan_vars_num == 0) && (0xfffffffc < (int)uVar7 - 0xaaU)) {
        bitmap_and_compl(bm,bm,gen_ctx->call_used_hard_regs[0x12]);
        uVar7 = *(ulong *)&pMVar2->field_0x18;
      }
      insn_var_iter.nops = uVar7 >> 0x20;
      insn_var_iter.op_num = 0;
      insn_var_iter.op_part_num = 0;
      local_70 = &local_78->insn_dead_vars;
      local_60 = pMVar2;
      insn_var_iter.insn = pMVar2;
LAB_00136932:
      iVar4 = input_insn_var_iterator_next(gen_ctx,&insn_var_iter,&var,&op_num);
      pMVar2 = local_60;
      MVar3 = var;
      if (iVar4 != 0) {
        uVar5 = var_to_scan_var(gen_ctx,var);
        if ((-1 < (int)uVar5) &&
           (iVar4 = bitmap_set_bit_p(bm,(ulong)uVar5), pDVar8 = local_70, iVar4 != 0)) {
          do {
            pdVar9 = pDVar8->head;
            if (pdVar9 == (dead_var_t_conflict)0x0) {
              pdVar9 = local_58->head;
              if (pdVar9 == (dead_var_t_conflict)0x0) {
                pdVar9 = (dead_var_t_conflict)gen_malloc(gen_ctx,0x18);
              }
              else {
                DLIST_dead_var_t_remove(local_58,pdVar9);
              }
              pdVar9->var = MVar3;
              DLIST_dead_var_t_append(local_70,pdVar9);
              break;
            }
            pDVar8 = (DLIST_dead_var_t *)&(pdVar9->dead_var_link).next;
          } while (pdVar9->var != MVar3);
        }
        goto LAB_00136932;
      }
      if (gen_ctx->lr_ctx->scan_vars_num == 0) {
        target_get_early_clobbered_hard_regs
                  (local_60,&early_clobbered_hard_reg1,&early_clobbered_hard_reg2);
        if ((ulong)early_clobbered_hard_reg1 != 0xffffffff) {
          bitmap_clear_bit_p(bm,(ulong)early_clobbered_hard_reg1);
        }
        if ((ulong)early_clobbered_hard_reg2 != 0xffffffff) {
          bitmap_clear_bit_p(bm,(ulong)early_clobbered_hard_reg2);
        }
        if (0xfffffffc < *(int *)&pMVar2->field_0x18 - 0xaaU) {
          bitmap_ior(bm,bm,local_78->call_hard_reg_args);
        }
      }
    }
    pDVar6 = (DLIST_bb_t *)&(local_68->bb_link).next;
  } while( true );
}

Assistant:

static void add_bb_insn_dead_vars (gen_ctx_t gen_ctx) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, prev_bb_insn;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  int scan_var, op_num;
  bitmap_t live;
  insn_var_iterator_t insn_var_iter;

  /* we need all var analysis and bb insns to keep dead var info */
  gen_assert (optimize_level > 0);
  live = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_copy (live, bb->live_out);
    for (bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = prev_bb_insn) {
      prev_bb_insn = DLIST_PREV (bb_insn_t, bb_insn);
      clear_bb_insn_dead_vars (gen_ctx, bb_insn);
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        bitmap_clear_bit_p (live, scan_var);
      }
      if (scan_vars_num == 0 && MIR_call_code_p (insn->code))
        bitmap_and_compl (live, live, call_used_hard_regs[MIR_T_UNDEF]);
      FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        if (bitmap_set_bit_p (live, scan_var)) add_bb_insn_dead_var (gen_ctx, bb_insn, var);
      }
      if (scan_vars_num != 0) continue;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg1);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg2);
      if (MIR_call_code_p (insn->code)) bitmap_ior (live, live, bb_insn->call_hard_reg_args);
    }
  }
  bitmap_destroy (live);
}